

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupPermFlop(Gia_Man_t *p,Vec_Int_t *vFfPerm)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  int iVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  
  if (vFfPerm->nSize != p->nRegs) {
    __assert_fail("Vec_IntSize(vFfPerm) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x35e,"Gia_Man_t *Gia_ManDupPermFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pName = pcVar6;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar1);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar1);
  }
  p_00->pSpec = pcVar6;
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  uVar10 = (ulong)(uint)pVVar9->nSize;
  if (p->nRegs < pVVar9->nSize) {
    lVar14 = 0;
    do {
      if ((int)uVar10 <= lVar14) goto LAB_001db10d;
      iVar4 = pVVar9->pArray[lVar14];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001db0ee;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar8 = p_00->pObjs;
      if ((pGVar7 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar7)) goto LAB_001db12c;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar8) >> 2) * -0x55555555);
      pGVar8 = p_00->pObjs;
      if ((pGVar7 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar7)) goto LAB_001db12c;
      pGVar2[iVar4].Value = (int)((ulong)((long)pGVar7 - (long)pGVar8) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar9 = p->vCis;
      uVar10 = (ulong)pVVar9->nSize;
    } while (lVar14 < (long)(uVar10 - (long)p->nRegs));
  }
  uVar10 = (ulong)(uint)p->nRegs;
  if (0 < p->nRegs) {
    lVar14 = 0;
    do {
      iVar4 = p->vCis->nSize;
      uVar10 = (ulong)(uint)(iVar4 - (int)uVar10) + lVar14;
      iVar11 = (int)uVar10;
      if ((iVar11 < 0) || (iVar4 <= iVar11)) goto LAB_001db10d;
      iVar4 = p->vCis->pArray[uVar10 & 0xffffffff];
      if ((iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001db0ee;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p_00->pObjs;
      if ((pGVar8 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar8)) {
LAB_001db12c:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar8 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar8)) goto LAB_001db12c;
      if (vFfPerm->nSize <= lVar14) goto LAB_001db10d;
      if (p->nRegs <= vFfPerm->pArray[lVar14]) {
        __assert_fail("v < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d6,"Gia_Obj_t *Gia_ManRo(Gia_Man_t *, int)");
      }
      iVar4 = p->vCis->nSize;
      uVar12 = (iVar4 - p->nRegs) + vFfPerm->pArray[lVar14];
      if (((int)uVar12 < 0) || (iVar4 <= (int)uVar12)) goto LAB_001db10d;
      iVar4 = p->vCis->pArray[uVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001db0ee;
      p->pObjs[iVar4].Value = (int)((ulong)((long)pGVar8 - (long)pGVar2) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      uVar10 = (ulong)p->nRegs;
    } while (lVar14 < (long)uVar10);
  }
  if (0 < p->nObjs) {
    lVar14 = 8;
    lVar15 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar10 = *(ulong *)((long)pGVar2 + lVar14 + -8);
      if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
        uVar12 = *(uint *)((long)pGVar2 +
                          lVar14 + (ulong)(uint)((int)(uVar10 & 0x1fffffff) << 2) * -3);
        if (((int)uVar12 < 0) ||
           (uVar13 = *(uint *)((long)pGVar2 +
                              lVar14 + (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar13 < 0)) goto LAB_001db14b;
        iVar4 = Gia_ManAppendAnd(p_00,uVar12 ^ (uint)(uVar10 >> 0x1d) & 1,
                                 uVar13 ^ (uint)(uVar10 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar14) = iVar4;
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar15 < p->nObjs);
  }
  pVVar9 = p->vCos;
  uVar10 = (ulong)(uint)pVVar9->nSize;
  if (p->nRegs < pVVar9->nSize) {
    lVar14 = 0;
    do {
      if ((int)uVar10 <= lVar14) goto LAB_001db10d;
      iVar4 = pVVar9->pArray[lVar14];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001db0ee;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0)
      goto LAB_001db14b;
      uVar12 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                    pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value
                              );
      pGVar2->Value = uVar12;
      lVar14 = lVar14 + 1;
      pVVar9 = p->vCos;
      uVar10 = (ulong)pVVar9->nSize;
    } while (lVar14 < (long)(uVar10 - (long)p->nRegs));
  }
  uVar12 = p->nRegs;
  uVar10 = (ulong)uVar12;
  if (0 < (int)uVar12) {
    lVar14 = 0;
    do {
      iVar4 = p->vCos->nSize;
      uVar12 = (uint)uVar10;
      uVar10 = (ulong)(iVar4 - uVar12) + lVar14;
      iVar11 = (int)uVar10;
      if ((iVar11 < 0) || (iVar4 <= iVar11)) {
LAB_001db10d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = p->vCos->pArray;
      iVar11 = piVar3[uVar10 & 0xffffffff];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) {
LAB_001db0ee:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (vFfPerm->nSize <= lVar14) goto LAB_001db10d;
      if ((int)uVar12 <= vFfPerm->pArray[lVar14]) {
        __assert_fail("v < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d7,"Gia_Obj_t *Gia_ManRi(Gia_Man_t *, int)");
      }
      uVar12 = vFfPerm->pArray[lVar14] + (iVar4 - uVar12);
      if (((int)uVar12 < 0) || (iVar4 <= (int)uVar12)) goto LAB_001db10d;
      iVar4 = piVar3[uVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001db0ee;
      uVar13 = (uint)*(undefined8 *)(pGVar2 + iVar4);
      uVar12 = (pGVar2 + iVar4)[-(ulong)(uVar13 & 0x1fffffff)].Value;
      if ((int)uVar12 < 0) {
LAB_001db14b:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar12 = Gia_ManAppendCo(p_00,uVar13 >> 0x1d & 1 ^ uVar12);
      pGVar2[iVar11].Value = uVar12;
      lVar14 = lVar14 + 1;
      uVar12 = p->nRegs;
      uVar10 = (ulong)(int)uVar12;
    } while (lVar14 < (long)uVar10);
  }
  Gia_ManSetRegNum(p_00,uVar12);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupPermFlop( Gia_Man_t * p, Vec_Int_t * vFfPerm )
{
    //Vec_Int_t * vPermInv;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vFfPerm) == Gia_ManRegNum(p) );
    //vPermInv = Vec_IntInvert( vFfPerm, -1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        //Gia_ManRo(p, Vec_IntEntry(vPermInv, i))->Value = Gia_ManAppendCi(pNew);
        Gia_ManRo(p, Vec_IntEntry(vFfPerm, i))->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        //pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy( Gia_ManRi(p, Vec_IntEntry(vPermInv, i)) ) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy( Gia_ManRi(p, Vec_IntEntry(vFfPerm, i)) ) );
    //Vec_IntFree( vPermInv );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}